

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O1

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint size;
  uint size_00;
  uint size_01;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int stride;
  uint uVar4;
  int i;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  float *pfVar11;
  ulong local_68;
  
  uVar2 = bottom_top_blob->dims;
  size = bottom_top_blob->w;
  size_00 = bottom_top_blob->h;
  size_01 = bottom_top_blob->d;
  uVar9 = bottom_top_blob->c;
  uVar3 = (ulong)uVar9;
  uVar4 = (this->axis >> 0x1f & uVar2) + this->axis;
  if (uVar2 == 1) {
    softmax((float *)bottom_top_blob->data,size);
  }
  if (0 < (int)size && ((uVar2 ^ 2) == 0 && uVar4 == 0)) {
    lVar10 = 0;
    do {
      softmax((float *)((long)bottom_top_blob->data + lVar10),size_00,size);
      lVar10 = lVar10 + 4;
    } while ((ulong)size * 4 - lVar10 != 0);
  }
  uVar1 = uVar4 ^ 1;
  if (0 < (int)size_00 && ((uVar2 ^ 2) == 0 && uVar1 == 0)) {
    uVar5 = 0;
    do {
      softmax((float *)((long)bottom_top_blob->w * uVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data),size);
      uVar5 = uVar5 + 1;
    } while (size_00 != uVar5);
  }
  if (((uVar2 == 3) && (uVar4 == 0)) && (0 < (int)(size_00 * size))) {
    lVar10 = 0;
    do {
      softmax((float *)((long)bottom_top_blob->data + lVar10),uVar9,(int)bottom_top_blob->cstep);
      lVar10 = lVar10 + 4;
    } while ((ulong)(size_00 * size) << 2 != lVar10);
  }
  if (0 < (int)uVar9 && ((uVar2 ^ 3) == 0 && uVar1 == 0)) {
    uVar5 = 0;
    do {
      if (0 < (int)size) {
        pfVar11 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        uVar8 = size;
        do {
          softmax(pfVar11,size_00,size);
          pfVar11 = pfVar11 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
  }
  if (0 < (int)uVar9 && ((uVar2 ^ 3) == 0 && (uVar4 ^ 2) == 0)) {
    local_68 = 0;
    do {
      if (0 < (int)size_00) {
        pfVar11 = (float *)(bottom_top_blob->cstep * bottom_top_blob->elemsize * local_68 +
                           (long)bottom_top_blob->data);
        uVar8 = size_00;
        do {
          softmax(pfVar11,size);
          pfVar11 = pfVar11 + (int)size;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      local_68 = local_68 + 1;
    } while (local_68 != uVar3);
  }
  if (((uVar2 == 4) && (uVar4 == 0)) && (uVar8 = size_00 * size * size_01, 0 < (int)uVar8)) {
    lVar10 = 0;
    do {
      softmax((float *)((long)bottom_top_blob->data + lVar10),uVar9,(int)bottom_top_blob->cstep);
      lVar10 = lVar10 + 4;
    } while ((ulong)uVar8 << 2 != lVar10);
  }
  uVar2 = uVar2 ^ 4;
  if (0 < (int)uVar9 && (uVar1 == 0 && uVar2 == 0)) {
    stride = size_00 * size;
    local_68 = 0;
    do {
      if (0 < stride) {
        pfVar11 = (float *)(bottom_top_blob->cstep * local_68 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        iVar6 = stride;
        do {
          softmax(pfVar11,size_01,stride);
          pfVar11 = pfVar11 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      local_68 = local_68 + 1;
    } while (local_68 != uVar3);
  }
  if (0 < (int)uVar9 && ((uVar4 ^ 2) == 0 && uVar2 == 0)) {
    local_68 = 0;
    do {
      if (0 < (int)size_01) {
        uVar5 = 0;
        do {
          if (0 < (int)size) {
            pfVar11 = (float *)((long)bottom_top_blob->data +
                               (long)bottom_top_blob->h * bottom_top_blob->elemsize *
                               (long)bottom_top_blob->w * uVar5 +
                               bottom_top_blob->cstep * local_68 * bottom_top_blob->elemsize);
            uVar7 = (ulong)size;
            do {
              softmax(pfVar11,size_00,size);
              pfVar11 = pfVar11 + 1;
              uVar1 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar1;
            } while (uVar1 != 0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != size_01);
      }
      local_68 = local_68 + 1;
    } while (local_68 != uVar3);
  }
  if (0 < (int)uVar9 && (uVar2 == 0 && uVar4 == 3)) {
    local_68 = 0;
    do {
      if (0 < (int)size_01) {
        pfVar11 = (float *)(bottom_top_blob->cstep * local_68 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        uVar2 = 0;
        do {
          uVar5 = (ulong)size_00;
          if (0 < (int)size_00) {
            do {
              softmax(pfVar11,size);
              pfVar11 = pfVar11 + (int)size;
              uVar9 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar9;
            } while (uVar9 != 0);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != size_01);
      }
      local_68 = local_68 + 1;
    } while (local_68 != uVar3);
  }
  return 0;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        softmax(ptr, w);
    }

    if (dims == 2 && positive_axis == 0)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, h, w);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w);
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        const int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                softmax(ptr, h, w);
                ptr += 1;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w);
                ptr += w;
            }
        }
    }

    if (dims == 4 && positive_axis == 0)
    {
        const int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w * h; i++)
            {
                softmax(ptr, d, w * h);
                ptr += 1;
            }
        }
    }

    if (dims == 4 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                for (int j = 0; j < w; j++)
                {
                    softmax(ptr, h, w);
                    ptr += 1;
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w);
                    ptr += w;
                }
            }
        }
    }

    return 0;
}